

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

void cleanup_test_files(void)

{
  uv_fs_t req;
  undefined1 local_1c0 [440];
  
  uv_fs_unlink(0,local_1c0,"test_dir/file1",0);
  uv_fs_req_cleanup(local_1c0);
  uv_fs_unlink(0,local_1c0,"test_dir/file2",0);
  uv_fs_req_cleanup(local_1c0);
  uv_fs_rmdir(0,local_1c0,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(local_1c0);
  uv_fs_rmdir(0,local_1c0,"test_dir",0);
  uv_fs_req_cleanup(local_1c0);
  return;
}

Assistant:

static void cleanup_test_files(void) {
  uv_fs_t req;

  uv_fs_unlink(NULL, &req, "test_dir/file1", NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_unlink(NULL, &req, "test_dir/file2", NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_rmdir(NULL, &req, "test_dir/test_subdir", NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_rmdir(NULL, &req, "test_dir", NULL);
  uv_fs_req_cleanup(&req);
}